

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Exception *
capnp::_::anon_unknown_18::toException(Exception *__return_storage_ptr__,Reader *exception)

{
  bool bVar1;
  Type TVar2;
  String *pSVar3;
  uint64_t typeId;
  Reader RVar4;
  Iterator IVar5;
  ArrayPtr<const_unsigned_char> content;
  Array<unsigned_char> local_150;
  undefined1 local_138 [8];
  Reader detail;
  undefined1 local_f8 [8];
  Iterator __end2;
  undefined1 local_d8 [8];
  Iterator __begin2;
  Reader *__range2;
  size_t local_88;
  String local_80;
  String local_68;
  undefined1 local_39;
  anon_class_8_1_6de856ef local_38;
  undefined1 local_30 [8];
  String reason;
  Reader *exception_local;
  Exception *result;
  
  local_38.exception = exception;
  reason.content.disposer = (ArrayDisposer *)exception;
  toException::anon_class_8_1_6de856ef::operator()((String *)local_30,&local_38);
  local_39 = 0;
  TVar2 = rpc::Exception::Reader::getType((Reader *)reason.content.disposer);
  pSVar3 = kj::mv<kj::String>((String *)local_30);
  kj::String::String(&local_68,pSVar3);
  kj::Exception::Exception(__return_storage_ptr__,(uint)TVar2,"(remote)",0,&local_68);
  kj::String::~String(&local_68);
  bVar1 = rpc::Exception::Reader::hasTrace((Reader *)reason.content.disposer);
  if (bVar1) {
    RVar4 = rpc::Exception::Reader::getTrace((Reader *)reason.content.disposer);
    local_88 = RVar4.super_StringPtr.content.size_;
    __range2 = RVar4.super_StringPtr.content.ptr;
    kj::str<capnp::Text::Reader>(&local_80,(Reader *)&__range2);
    kj::Exception::setRemoteTrace(__return_storage_ptr__,&local_80);
    kj::String::~String(&local_80);
  }
  rpc::Exception::Reader::getDetails((Reader *)&__begin2.index,(Reader *)reason.content.disposer);
  IVar5 = List<capnp::rpc::Exception::Detail,_(capnp::Kind)3>::Reader::begin
                    ((Reader *)&__begin2.index);
  __end2._8_8_ = IVar5.container;
  __begin2.container._0_4_ = IVar5.index;
  local_d8 = (undefined1  [8])__end2._8_8_;
  IVar5 = List<capnp::rpc::Exception::Detail,_(capnp::Kind)3>::Reader::end
                    ((Reader *)&__begin2.index);
  detail._reader._40_8_ = IVar5.container;
  __end2.container._0_4_ = IVar5.index;
  local_f8 = (undefined1  [8])detail._reader._40_8_;
  while (bVar1 = IndexingIterator<const_capnp::List<capnp::rpc::Exception::Detail,_(capnp::Kind)3>::Reader,_capnp::rpc::Exception::Detail::Reader>
                 ::operator==((IndexingIterator<const_capnp::List<capnp::rpc::Exception::Detail,_(capnp::Kind)3>::Reader,_capnp::rpc::Exception::Detail::Reader>
                               *)local_d8,
                              (IndexingIterator<const_capnp::List<capnp::rpc::Exception::Detail,_(capnp::Kind)3>::Reader,_capnp::rpc::Exception::Detail::Reader>
                               *)local_f8), ((bVar1 ^ 0xffU) & 1) != 0) {
    IndexingIterator<const_capnp::List<capnp::rpc::Exception::Detail,_(capnp::Kind)3>::Reader,_capnp::rpc::Exception::Detail::Reader>
    ::operator*((Reader *)local_138,
                (IndexingIterator<const_capnp::List<capnp::rpc::Exception::Detail,_(capnp::Kind)3>::Reader,_capnp::rpc::Exception::Detail::Reader>
                 *)local_d8);
    bVar1 = rpc::Exception::Detail::Reader::hasData((Reader *)local_138);
    if (bVar1) {
      typeId = rpc::Exception::Detail::Reader::getDetailId((Reader *)local_138);
      content = (ArrayPtr<const_unsigned_char>)
                rpc::Exception::Detail::Reader::getData((Reader *)local_138);
      kj::heapArray<unsigned_char>(&local_150,content);
      kj::Exception::setDetail(__return_storage_ptr__,typeId,&local_150);
      kj::Array<unsigned_char>::~Array(&local_150);
    }
    IndexingIterator<const_capnp::List<capnp::rpc::Exception::Detail,_(capnp::Kind)3>::Reader,_capnp::rpc::Exception::Detail::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::rpc::Exception::Detail,_(capnp::Kind)3>::Reader,_capnp::rpc::Exception::Detail::Reader>
                  *)local_d8);
  }
  local_39 = 1;
  kj::String::~String((String *)local_30);
  return __return_storage_ptr__;
}

Assistant:

kj::Exception toException(const rpc::Exception::Reader& exception) {
  auto reason = [&]() {
    if (exception.getReason().startsWith("remote exception: ")) {
      return kj::str(exception.getReason());
    } else {
      return kj::str("remote exception: ", exception.getReason());
    }
  }();

  kj::Exception result(static_cast<kj::Exception::Type>(exception.getType()),
      "(remote)", 0, kj::mv(reason));
  if (exception.hasTrace()) {
    result.setRemoteTrace(kj::str(exception.getTrace()));
  }
  for (auto detail : exception.getDetails()) {
    if (detail.hasData()) {
      result.setDetail(detail.getDetailId(), kj::heapArray(detail.getData()));
    }
  }
  return result;
}